

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_se(test_state *state)

{
  int iVar1;
  long lVar2;
  uchar *puVar3;
  
  iVar1 = state->bytes_per_sample;
  lVar2 = (long)iVar1;
  if ((state->strm->flags & 8) == 0) {
    if (0 < (long)state->buf_len) {
      puVar3 = state->ubuf;
      do {
        (*state->out)(puVar3,0,iVar1);
        (*state->out)(puVar3 + lVar2,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 2,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 3,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 4,1,iVar1);
        (*state->out)(puVar3 + iVar1 * 5,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 6,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 7,2,iVar1);
        puVar3 = puVar3 + lVar2 * 8;
      } while (puVar3 < state->ubuf + state->buf_len);
    }
  }
  else if (0 < (long)state->buf_len) {
    puVar3 = state->ubuf;
    do {
      (*state->out)(puVar3,state->xmax - 1,iVar1);
      (*state->out)(puVar3 + lVar2,state->xmax - 1,iVar1);
      (*state->out)(puVar3 + iVar1 * 2,state->xmax - 1,iVar1);
      (*state->out)(puVar3 + iVar1 * 3,state->xmax - 1,iVar1);
      (*state->out)(puVar3 + iVar1 * 4,state->xmax,iVar1);
      (*state->out)(puVar3 + iVar1 * 5,state->xmax,iVar1);
      (*state->out)(puVar3 + iVar1 * 6,state->xmax,iVar1);
      (*state->out)(puVar3 + iVar1 * 7,state->xmax,iVar1);
      puVar3 = puVar3 + iVar1 * 8;
    } while (puVar3 < state->ubuf + state->buf_len);
  }
  printf("Checking Second Extension ... ");
  iVar1 = check_block_sizes(state,1,state->id_len + 1);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int check_se(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 8 * size) {
            state->out(tmp, state->xmax - 1, size);
            state->out(tmp + size, state->xmax - 1, size);
            state->out(tmp + 2 * size, state->xmax - 1, size);
            state->out(tmp + 3 * size, state->xmax - 1, size);
            state->out(tmp + 4 * size, state->xmax, size);
            state->out(tmp + 5 * size, state->xmax, size);
            state->out(tmp + 6 * size, state->xmax, size);
            state->out(tmp + 7 * size, state->xmax, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 8 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, 0, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, 0, size);
            state->out(tmp + 4 * size, 1, size);
            state->out(tmp + 5 * size, 0, size);
            state->out(tmp + 6 * size, 0, size);
            state->out(tmp + 7 * size, 2, size);
        }
    }

    printf("Checking Second Extension ... ");
    status = check_block_sizes(state, 1, state->id_len + 1);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}